

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O2

int32_t ucnv_toUChars_63(UConverter *cnv,UChar *dest,int32_t destCapacity,char *src,
                        int32_t srcLength,UErrorCode *pErrorCode)

{
  UErrorCode UVar1;
  int32_t iVar2;
  size_t sVar3;
  int iVar4;
  long lVar5;
  uint length;
  ulong uVar6;
  UChar *dest_local;
  int local_844;
  char *src_local;
  UChar buffer [1024];
  UChar local_38 [4];
  
  iVar2 = 0;
  if ((pErrorCode != (UErrorCode *)0x0) && (iVar2 = 0, *pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((destCapacity < 0 || cnv == (UConverter *)0x0) ||
       ((srcLength < -1 || dest == (UChar *)0x0 && destCapacity != 0 ||
        (src == (char *)0x0 && srcLength != 0)))) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      iVar2 = 0;
    }
    else {
      dest_local = dest;
      src_local = src;
      ucnv_resetToUnicode_63(cnv);
      if (srcLength == -1) {
        sVar3 = strlen(src);
        srcLength = (int32_t)sVar3;
      }
      if (srcLength < 1) {
        length = 0;
      }
      else {
        if (destCapacity == 0) {
          destCapacity = 0;
        }
        else {
          lVar5 = 0x1ffffffff;
          if (dest < (UChar *)0xffffffff80000001) {
            lVar5 = (long)dest + 0x7fffffff;
          }
          iVar4 = (int)((ulong)(lVar5 - (long)dest) >> 1);
          if (iVar4 < destCapacity) {
            destCapacity = iVar4;
          }
        }
        ucnv_toUnicode_63(cnv,&dest_local,dest + destCapacity,&src_local,src + (uint)srcLength,
                          (int32_t *)0x0,'\x01',pErrorCode);
        uVar6 = (ulong)((long)dest_local - (long)dest) >> 1;
        length = (uint)uVar6;
        UVar1 = *pErrorCode;
        while (UVar1 == U_BUFFER_OVERFLOW_ERROR) {
          *pErrorCode = U_ZERO_ERROR;
          dest_local = buffer;
          local_844 = destCapacity;
          ucnv_toUnicode_63(cnv,&dest_local,local_38,&src_local,src + (uint)srcLength,(int32_t *)0x0
                            ,'\x01',pErrorCode);
          length = (int)uVar6 + (int)((ulong)((long)dest_local - (long)buffer) >> 1);
          uVar6 = (ulong)length;
          destCapacity = local_844;
          UVar1 = *pErrorCode;
        }
      }
      iVar2 = u_terminateUChars_63(dest,destCapacity,length,pErrorCode);
    }
  }
  return iVar2;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucnv_toUChars(UConverter *cnv,
              UChar *dest, int32_t destCapacity,
              const char *src, int32_t srcLength,
              UErrorCode *pErrorCode) {
    const char *srcLimit;
    UChar *originalDest, *destLimit;
    int32_t destLength;

    /* check arguments */
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    if( cnv==NULL ||
        destCapacity<0 || (destCapacity>0 && dest==NULL) ||
        srcLength<-1 || (srcLength!=0 && src==NULL))
    {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* initialize */
    ucnv_resetToUnicode(cnv);
    originalDest=dest;
    if(srcLength==-1) {
        srcLength=(int32_t)uprv_strlen(src);
    }
    if(srcLength>0) {
        srcLimit=src+srcLength;
        destCapacity=pinCapacity(dest, destCapacity);
        destLimit=dest+destCapacity;

        /* perform the conversion */
        ucnv_toUnicode(cnv, &dest, destLimit, &src, srcLimit, 0, TRUE, pErrorCode);
        destLength=(int32_t)(dest-originalDest);

        /* if an overflow occurs, then get the preflighting length */
        if(*pErrorCode==U_BUFFER_OVERFLOW_ERROR)
        {
            UChar buffer[1024];

            destLimit=buffer+UPRV_LENGTHOF(buffer);
            do {
                dest=buffer;
                *pErrorCode=U_ZERO_ERROR;
                ucnv_toUnicode(cnv, &dest, destLimit, &src, srcLimit, 0, TRUE, pErrorCode);
                destLength+=(int32_t)(dest-buffer);
            }
            while(*pErrorCode==U_BUFFER_OVERFLOW_ERROR);
        }
    } else {
        destLength=0;
    }

    return u_terminateUChars(originalDest, destCapacity, destLength, pErrorCode);
}